

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

ImageChannelValues * __thiscall
pbrt::Image::MSE(Image *this,ImageChannelDesc *desc,Image *ref,Image *mseImage)

{
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  WrapMode2D wrapMode;
  WrapMode2D wrapMode_00;
  bool bVar1;
  undefined1 uVar2;
  size_t sVar3;
  Point2i PVar4;
  ulong uVar5;
  reference pvVar6;
  reference pvVar7;
  Image *in_RCX;
  Image *in_RSI;
  ImageChannelValues *in_RDI;
  long in_R8;
  float fVar8;
  double dVar9;
  Tuple2<pbrt::Point2,_int> p;
  int c_1;
  double se;
  int c;
  ImageChannelValues vref;
  ImageChannelValues v;
  int x;
  int y;
  Point2i vb;
  Point2i va;
  ImageChannelDesc refDesc;
  vector<double,_std::allocator<double>_> sumSE;
  ImageChannelValues *mse;
  Image *in_stack_fffffffffffffc38;
  Image *in_stack_fffffffffffffc40;
  allocator_type *in_stack_fffffffffffffc48;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffc50;
  size_type in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc64;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  Image *in_stack_fffffffffffffc78;
  char (*in_stack_fffffffffffffc88) [17];
  ImageChannelDesc *in_stack_fffffffffffffc90;
  Image *in_stack_fffffffffffffc98;
  undefined8 in_stack_fffffffffffffca0;
  char *in_stack_fffffffffffffca8;
  undefined8 in_stack_fffffffffffffcb0;
  LogLevel level;
  Tuple2<pbrt::Point2,_int> TVar10;
  undefined7 in_stack_fffffffffffffcb8;
  char (*in_stack_fffffffffffffcc0) [13];
  Point2<int> *in_stack_fffffffffffffcc8;
  char (*in_stack_fffffffffffffcd0) [17];
  Point2<int> *in_stack_fffffffffffffcd8;
  Image *in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd20;
  undefined7 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2f;
  PixelFormat format;
  Image *this_00;
  Allocator in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  undefined4 in_stack_fffffffffffffd88;
  int iVar11;
  undefined4 in_stack_fffffffffffffd8c;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffd90;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffd98;
  WrapMode in_stack_fffffffffffffda0;
  WrapMode in_stack_fffffffffffffda4;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffda8;
  int local_1d8;
  int local_1d0;
  int iStack_1c8;
  int local_1c4;
  Image *local_1c0;
  Tuple2<pbrt::Point2,_int> local_d8 [17];
  undefined1 local_49 [33];
  long local_28;
  Image *local_20;
  
  level = (LogLevel)((ulong)in_stack_fffffffffffffcb0 >> 0x20);
  iVar11 = (int)((ulong)in_stack_fffffffffffffca0 >> 0x20);
  local_28 = in_R8;
  local_20 = in_RCX;
  sVar3 = ImageChannelDesc::size((ImageChannelDesc *)0x51a80f);
  format = (PixelFormat)(sVar3 >> 0x20);
  local_49._1_8_ = 0;
  this_00 = (Image *)local_49;
  std::allocator<double>::allocator((allocator<double> *)0x51a838);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),in_stack_fffffffffffffc58
             ,(value_type_conflict5 *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  std::allocator<double>::~allocator((allocator<double> *)0x51a86c);
  ChannelNames_abi_cxx11_(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
  pstd::span<std::__cxx11::string_const>::span<std::__cxx11::string>
            (in_stack_fffffffffffffc50,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffc48);
  requestedChannels.n._0_7_ = in_stack_fffffffffffffd28;
  requestedChannels.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       in_stack_fffffffffffffd20;
  requestedChannels.n._7_1_ = in_stack_fffffffffffffd2f;
  GetChannelDesc(in_stack_fffffffffffffd18,requestedChannels);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffc50);
  bVar1 = ImageChannelDesc::operator_cast_to_bool((ImageChannelDesc *)0x51a8f1);
  if (!bVar1) {
    ChannelNames_abi_cxx11_(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
    ErrorExit<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((char *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
               in_stack_fffffffffffffc68);
  }
  local_d8[0] = (Tuple2<pbrt::Point2,_int>)Resolution(in_RSI);
  PVar4 = Resolution(local_20);
  bVar1 = Tuple2<pbrt::Point2,_int>::operator==
                    (local_d8,(Point2<int>)PVar4.super_Tuple2<pbrt::Point2,_int>);
  if (!bVar1) {
    LogFatal<char_const(&)[13],char_const(&)[17],char_const(&)[13],pbrt::Point2<int>&,char_const(&)[17],pbrt::Point2<int>&>
              (level,in_stack_fffffffffffffca8,iVar11,(char *)in_stack_fffffffffffffc98,
               (char (*) [13])in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
               in_stack_fffffffffffffcc0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcd0,
               in_stack_fffffffffffffcd8);
  }
  if (local_28 != 0) {
    Resolution(in_RSI);
    ChannelNames_abi_cxx11_(in_stack_fffffffffffffc78);
    pstd::span<std::__cxx11::string_const>::span<std::__cxx11::string>
              (in_stack_fffffffffffffc50,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffc48);
    ColorEncoding::TaggedPointer
              ((ColorEncoding *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffc40);
    channels.ptr._4_4_ = in_stack_fffffffffffffd84;
    channels.ptr._0_4_ = in_stack_fffffffffffffd80;
    channels.n._0_4_ = in_stack_fffffffffffffd88;
    channels.n._4_4_ = in_stack_fffffffffffffd8c;
    Image(this_00,format,(Point2i)in_stack_fffffffffffffd90,channels,(ColorEncoding *)in_RSI,
          in_stack_fffffffffffffd78);
    operator=(in_stack_fffffffffffffc40,local_1c0);
    ~Image(in_stack_fffffffffffffc40);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffc50);
    in_stack_fffffffffffffc38 = local_1c0;
  }
  local_1c4 = 0;
  while( true ) {
    PVar4 = Resolution(in_RSI);
    iStack_1c8 = PVar4.super_Tuple2<pbrt::Point2,_int>.y;
    if (iStack_1c8 <= local_1c4) break;
    local_1d0 = 0;
    while( true ) {
      PVar4 = Resolution(in_RSI);
      local_1d8 = PVar4.super_Tuple2<pbrt::Point2,_int>.x;
      if (local_1d8 <= local_1d0) break;
      Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffffc40,
                          (int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
                          (int)in_stack_fffffffffffffc38);
      WrapMode2D::WrapMode2D
                ((WrapMode2D *)in_stack_fffffffffffffc50,
                 (WrapMode)((ulong)in_stack_fffffffffffffc48 >> 0x20));
      wrapMode.wrap.values[1] = in_stack_fffffffffffffda4;
      wrapMode.wrap.values[0] = in_stack_fffffffffffffda0;
      GetChannels((Image *)in_stack_fffffffffffffd98,(Point2i)in_stack_fffffffffffffda8,
                  (ImageChannelDesc *)in_stack_fffffffffffffd90,wrapMode);
      Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffffc40,
                          (int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
                          (int)in_stack_fffffffffffffc38);
      WrapMode2D::WrapMode2D
                ((WrapMode2D *)in_stack_fffffffffffffc50,
                 (WrapMode)((ulong)in_stack_fffffffffffffc48 >> 0x20));
      wrapMode_00.wrap.values[1] = in_stack_fffffffffffffda4;
      wrapMode_00.wrap.values[0] = in_stack_fffffffffffffda0;
      GetChannels((Image *)in_stack_fffffffffffffd98,(Point2i)in_stack_fffffffffffffda8,
                  (ImageChannelDesc *)in_stack_fffffffffffffd90,wrapMode_00);
      for (in_stack_fffffffffffffda4 = Black; uVar5 = (ulong)(int)in_stack_fffffffffffffda4,
          sVar3 = ImageChannelDesc::size((ImageChannelDesc *)0x51adb2), uVar5 < sVar3;
          in_stack_fffffffffffffda4 = in_stack_fffffffffffffda4 + Clamp) {
        pvVar6 = InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                           ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                            in_stack_fffffffffffffc40,(size_type)in_stack_fffffffffffffc38);
        dVar9 = (double)*pvVar6;
        pvVar6 = InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                           ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                            in_stack_fffffffffffffc40,(size_type)in_stack_fffffffffffffc38);
        p = (Tuple2<pbrt::Point2,_int>)Sqr<double>(dVar9 - (double)*pvVar6);
        TVar10 = p;
        uVar2 = IsInf<double>(2.64477342150551e-317);
        in_stack_fffffffffffffd98 = TVar10;
        if (!(bool)uVar2) {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_49 + 9),
                              (long)(int)in_stack_fffffffffffffda4);
          *pvVar7 = (double)TVar10 + *pvVar7;
          if (local_28 != 0) {
            Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffffc40,
                                (int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
                                (int)in_stack_fffffffffffffc38);
            SetChannel((Image *)CONCAT17(uVar2,in_stack_fffffffffffffcb8),(Point2i)p,TVar10.y,
                       (Float)TVar10.x);
          }
        }
      }
      ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x51af89);
      ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x51af96);
      local_1d0 = local_1d0 + 1;
    }
    local_1c4 = local_1c4 + 1;
  }
  ImageChannelDesc::size((ImageChannelDesc *)0x51afeb);
  ImageChannelValues::ImageChannelValues
            ((ImageChannelValues *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
             in_stack_fffffffffffffc58,(Float)((ulong)in_stack_fffffffffffffc50 >> 0x20));
  iVar11 = 0;
  while( true ) {
    uVar5 = (ulong)iVar11;
    sVar3 = ImageChannelDesc::size((ImageChannelDesc *)0x51b02f);
    if (sVar3 <= uVar5) break;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_49 + 9),(long)iVar11);
    dVar9 = *pvVar7;
    PVar4 = Resolution(in_RSI);
    fVar8 = (float)PVar4.super_Tuple2<pbrt::Point2,_int>.x;
    PVar4 = Resolution(in_RSI);
    fVar8 = (float)(dVar9 / (double)(fVar8 * (float)PVar4.super_Tuple2<pbrt::Point2,_int>.y));
    pvVar6 = InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                       ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                        in_stack_fffffffffffffc40,(size_type)in_stack_fffffffffffffc38);
    *pvVar6 = fVar8;
    iVar11 = iVar11 + 1;
  }
  ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x51b174);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc50);
  return in_RDI;
}

Assistant:

ImageChannelValues Image::MSE(const ImageChannelDesc &desc, const Image &ref,
                              Image *mseImage) const {
    std::vector<double> sumSE(desc.size(), 0.);

    ImageChannelDesc refDesc = ref.GetChannelDesc(ChannelNames(desc));
    if (!refDesc)
        ErrorExit("Channels not found in image: %s", ChannelNames(desc));

    CHECK_EQ(Resolution(), ref.Resolution());

    if (mseImage)
        *mseImage = Image(PixelFormat::Float, Resolution(), ChannelNames());

    for (int y = 0; y < Resolution().y; ++y)
        for (int x = 0; x < Resolution().x; ++x) {
            ImageChannelValues v = GetChannels({x, y}, desc);
            ImageChannelValues vref = ref.GetChannels({x, y}, refDesc);

            for (int c = 0; c < desc.size(); ++c) {
                double se = Sqr(double(v[c]) - double(vref[c]));
                if (IsInf(se))
                    continue;
                sumSE[c] += se;
                if (mseImage)
                    mseImage->SetChannel({x, y}, c, se);
            }
        }

    ImageChannelValues mse(desc.size());
    for (int c = 0; c < desc.size(); ++c)
        mse[c] = sumSE[c] / (Float(Resolution().x) * Float(Resolution().y));
    return mse;
}